

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::TType(TType *this,TTypeList *userDef,TString *n)

{
  TString *pTVar1;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_0089a590;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf0000000 | 0x10f;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = userDef;
  this->fieldName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  this->sampler = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
  TQualifier::clear(&this->qualifier);
  pTVar1 = NewPoolTString_abi_cxx11_((n->_M_dataplus)._M_p);
  this->typeName = pTVar1;
  return;
}

Assistant:

TType(TTypeList* userDef, const TString& n) :
                            basicType(EbtStruct), vectorSize(1), matrixCols(0), matrixRows(0), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
                            arraySizes(nullptr), structure(userDef), fieldName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                sampler.clear();
                                qualifier.clear();
                                typeName = NewPoolTString(n.c_str());
                            }